

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

string * __thiscall
Dashel::DashelException::sourceToString_abi_cxx11_
          (string *__return_storage_ptr__,DashelException *this,Source s)

{
  char *__s;
  allocator<char> local_85 [20];
  allocator<char> local_71;
  undefined8 local_70;
  size_t arrayLength;
  char *sourceNames [9];
  Source s_local;
  
  memcpy(&arrayLength,&PTR_anon_var_dwarf_1821b_00152ad0,0x48);
  local_70 = 9;
  if ((uint)this < 9) {
    __s = sourceNames[((ulong)this & 0xffffffff) - 1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_85);
    std::allocator<char>::~allocator(local_85);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)arrayLength,&local_71);
    std::allocator<char>::~allocator(&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

string DashelException::sourceToString(Source s)
	{
		// clang-format off
		const char* const sourceNames[] =
		{
			"Unknown cause",
			"Synchronisation error",
			"Invalid target",
			"Invalid operation",
			"Connection lost",
			"I/O error",
			"Connection failed",
			"Enumeration error",
			"Previous incoming data not read"
		};
		// clang-format on
		const size_t arrayLength(sizeof(sourceNames) / sizeof(const char*));
		if (s >= arrayLength)
			return sourceNames[0];
		else
			return sourceNames[s];
	}